

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Table(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *o)

{
  bool bVar1;
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  *pDVar2;
  size_t numElements;
  size_t __size;
  void *t;
  Node *pNVar3;
  size_t numElementsWithBuffer;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *o_local;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  pDVar2 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>*>
                     (&this->mMask);
  this->mKeyVals = pDVar2;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mMaxNumElementsAllowed = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  bVar1 = empty(o);
  if (!bVar1) {
    numElements = calcNumElementsWithBuffer(this,o->mMask + 1);
    __size = calcNumBytesTotal(this,numElements);
    t = malloc(__size);
    pNVar3 = (Node *)assertNotNull<std::bad_alloc,void>(t);
    this->mKeyVals = pNVar3;
    this->mInfo = (uint8_t *)(this->mKeyVals + numElements);
    this->mNumElements = o->mNumElements;
    this->mMask = o->mMask;
    this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
    this->mInfoInc = o->mInfoInc;
    this->mInfoHashShift = o->mInfoHashShift;
    cloneData(this,o);
  }
  return;
}

Assistant:

Table(const Table& o)
        : WHash(static_cast<const WHash&>(o))
        , WKeyEqual(static_cast<const WKeyEqual&>(o))
        , DataPool(static_cast<const DataPool&>(o)) {
        ROBIN_HOOD_TRACE(this)
        if (!o.empty()) {
            // not empty: create an exact copy. it is also possible to just iterate through all
            // elements and insert them, but copying is probably faster.

            auto const numElementsWithBuffer = calcNumElementsWithBuffer(o.mMask + 1);
            mKeyVals = static_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
                std::malloc(calcNumBytesTotal(numElementsWithBuffer))));
            // no need for calloc because clonData does memcpy
            mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);
            mNumElements = o.mNumElements;
            mMask = o.mMask;
            mMaxNumElementsAllowed = o.mMaxNumElementsAllowed;
            mInfoInc = o.mInfoInc;
            mInfoHashShift = o.mInfoHashShift;
            cloneData(o);
        }
    }